

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_promise_then_finally_func
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic,
                  JSValue *func_data)

{
  JSValue v;
  JSValue v_00;
  JSValue this_val_00;
  JSValue v_01;
  JSValue func_obj;
  JSValue v_02;
  JSValue this_val_01;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  undefined4 in_ECX;
  undefined8 in_R8;
  int in_R9D;
  JSValue JVar4;
  undefined8 *in_stack_00000008;
  JSValue then_func;
  JSValue ret;
  JSValue promise;
  JSValue res;
  JSValue onFinally;
  JSValue ctor;
  undefined8 uVar5;
  JSContext *in_stack_ffffffffffffff00;
  JSValueUnion in_stack_ffffffffffffff08;
  JSValueUnion in_stack_ffffffffffffff10;
  void *local_e8;
  JSValueUnion local_e0;
  JSContext *in_stack_ffffffffffffff30;
  ulong in_stack_ffffffffffffff38;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff44;
  int data_len;
  undefined4 in_stack_ffffffffffffff50;
  int magic_00;
  undefined4 in_stack_ffffffffffffff54;
  int length;
  JSValueUnion func;
  JSContext *in_stack_ffffffffffffff60;
  void *local_98;
  JSValue *in_stack_ffffffffffffff70;
  int magic_01;
  JSValue *argv_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  JSValueUnion local_10;
  JSValueUnion local_8;
  
  argv_00 = (JSValue *)*in_stack_00000008;
  iVar3 = (int)((ulong)in_stack_00000008[1] >> 0x20);
  magic_01 = (int)((ulong)in_stack_00000008[3] >> 0x20);
  uVar6 = 0;
  data_len = 0;
  uVar5 = 0;
  func_obj.tag._0_4_ = in_stack_ffffffffffffff50;
  func_obj.u.float64 = 1.48219693752374e-323;
  func_obj.tag._4_4_ = in_stack_ffffffffffffff54;
  JVar4.tag._0_4_ = 0;
  JVar4.u = (JSValueUnion)in_stack_ffffffffffffff38;
  JVar4.tag._4_4_ = in_stack_ffffffffffffff44;
  JVar4 = JS_Call(in_stack_ffffffffffffff30,func_obj,JVar4,local_e0._12_4_,in_stack_ffffffffffffff70
                 );
  magic_00 = JVar4.u._0_4_;
  length = JVar4.u._4_4_;
  local_8 = (JSValueUnion)JVar4.tag;
  local_10 = JVar4.u;
  func = local_8;
  iVar2 = JS_IsException(JVar4);
  if (iVar2 == 0) {
    this_val_01.tag._0_4_ = in_stack_ffffffffffffffd0;
    this_val_01.u = (JSValueUnion)in_R8;
    this_val_01.tag._4_4_ = in_ECX;
    JVar4 = js_promise_resolve((JSContext *)CONCAT44(in_R9D,in_stack_ffffffffffffffc0),this_val_01,
                               iVar3,argv_00,magic_01);
    local_10 = JVar4.u;
    local_8 = (JSValueUnion)JVar4.tag;
    v.tag = (int64_t)in_stack_ffffffffffffff10.ptr;
    v.u.float64 = in_stack_ffffffffffffff08.float64;
    JS_FreeValue(in_stack_ffffffffffffff00,v);
    iVar3 = JS_IsException(JVar4);
    if (iVar3 == 0) {
      if (in_R9D == 0) {
        JVar4 = JS_NewCFunctionData(in_stack_ffffffffffffff60,(JSCFunctionData *)func.ptr,length,
                                    magic_00,data_len,
                                    (JSValue *)CONCAT44(in_stack_ffffffffffffff44,uVar6));
        local_e0 = JVar4.u;
        local_98 = (void *)JVar4.tag;
      }
      else {
        JVar4 = JS_NewCFunctionData(in_stack_ffffffffffffff60,(JSCFunctionData *)func.ptr,length,
                                    magic_00,data_len,
                                    (JSValue *)CONCAT44(in_stack_ffffffffffffff44,uVar6));
        in_stack_ffffffffffffff10 = JVar4.u;
        local_e8 = (void *)JVar4.tag;
        local_98 = local_e8;
        local_e0 = in_stack_ffffffffffffff10;
      }
      v_02.tag = (int64_t)local_98;
      v_02.u.ptr = local_e0.ptr;
      iVar3 = JS_IsException(v_02);
      if (iVar3 == 0) {
        this_val_00.tag = (int64_t)in_stack_ffffffffffffff10.ptr;
        this_val_00.u.ptr = in_stack_ffffffffffffff08.ptr;
        JVar4 = JS_InvokeFree(in_stack_ffffffffffffff00,this_val_00,(JSAtom)((ulong)uVar5 >> 0x20),
                              (int)uVar5,(JSValue *)0x182183);
        local_10 = JVar4.u;
        local_8 = (JSValueUnion)JVar4.tag;
        v_01.tag = (int64_t)in_stack_ffffffffffffff10.ptr;
        v_01.u.ptr = local_8.ptr;
        JS_FreeValue((JSContext *)local_10.ptr,v_01);
      }
      else {
        v_00.tag = (int64_t)in_stack_ffffffffffffff10.ptr;
        v_00.u.ptr = in_stack_ffffffffffffff08.ptr;
        JS_FreeValue(in_stack_ffffffffffffff00,v_00);
        local_8.ptr = local_98;
        local_10 = local_e0;
      }
    }
  }
  JVar1.tag = (int64_t)local_8.ptr;
  JVar1.u.ptr = local_10.ptr;
  return JVar1;
}

Assistant:

static JSValue js_promise_then_finally_func(JSContext *ctx, JSValueConst this_val,
                                            int argc, JSValueConst *argv,
                                            int magic, JSValue *func_data)
{
    JSValueConst ctor = func_data[0];
    JSValueConst onFinally = func_data[1];
    JSValue res, promise, ret, then_func;

    res = JS_Call(ctx, onFinally, JS_UNDEFINED, 0, NULL);
    if (JS_IsException(res))
        return res;
    promise = js_promise_resolve(ctx, ctor, 1, (JSValueConst *)&res, 0);
    JS_FreeValue(ctx, res);
    if (JS_IsException(promise))
        return promise;
    if (magic == 0) {
        then_func = JS_NewCFunctionData(ctx, js_promise_finally_value_thunk, 0,
                                        0, 1, argv);
    } else {
        then_func = JS_NewCFunctionData(ctx, js_promise_finally_thrower, 0,
                                        0, 1, argv);
    }
    if (JS_IsException(then_func)) {
        JS_FreeValue(ctx, promise);
        return then_func;
    }
    ret = JS_InvokeFree(ctx, promise, JS_ATOM_then, 1, (JSValueConst *)&then_func);
    JS_FreeValue(ctx, then_func);
    return ret;
}